

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O3

void Abc_QuickSort2(word *pData,int nSize,int fDecrease)

{
  word wVar1;
  long lVar2;
  word wVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int l;
  ulong uVar8;
  ulong uVar9;
  
  uVar5 = nSize - 1;
  l = 0;
  if (fDecrease != 0) {
    Abc_QuickSort2Dec_rec(pData,0,uVar5);
    return;
  }
  if ((int)uVar5 < 1) {
    return;
  }
LAB_0042fbff:
  uVar4 = uVar5 - l;
  if ((int)uVar4 < 10) {
    if ((int)uVar4 < 1) {
      return;
    }
    uVar9 = 1;
    uVar7 = 0;
    do {
      uVar6 = uVar7 & 0xffffffff;
      uVar8 = uVar9;
      do {
        uVar5 = (uint)uVar8;
        if ((uint)pData[(long)l + (long)(int)(uint)uVar6] <= (uint)pData[(long)l + uVar8]) {
          uVar5 = (uint)uVar6;
        }
        uVar8 = uVar8 + 1;
        uVar6 = (ulong)uVar5;
      } while (uVar4 + 1 != uVar8);
      wVar3 = pData[(long)l + uVar7];
      pData[(long)l + uVar7] = pData[(long)l + (long)(int)uVar5];
      uVar7 = uVar7 + 1;
      pData[(long)l + (long)(int)uVar5] = wVar3;
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar4);
    return;
  }
  uVar9 = (ulong)(l - 1);
  wVar3 = pData[(int)uVar5];
  uVar7 = (ulong)uVar5;
  do {
    uVar9 = (long)(int)uVar9;
    do {
      uVar8 = uVar9;
      wVar1 = pData[uVar8 + 1];
      uVar9 = uVar8 + 1;
    } while ((uint)wVar1 < (uint)wVar3);
    uVar6 = (long)(int)uVar7;
    do {
      lVar2 = uVar6 - 1;
      uVar7 = uVar6 - 1;
      if (l + 1 == (int)uVar6) break;
      uVar6 = uVar7;
    } while ((uint)wVar3 < (uint)pData[lVar2]);
    if ((long)uVar7 <= (long)uVar9) break;
    pData[uVar9] = pData[lVar2];
    pData[uVar7] = wVar1;
  } while( true );
  pData[uVar9] = pData[(int)uVar5];
  pData[(int)uVar5] = wVar1;
  Abc_QuickSort2Inc_rec(pData,l,(int)uVar8);
  l = (int)uVar8 + 2;
  if ((int)uVar5 <= l) {
    return;
  }
  goto LAB_0042fbff;
}

Assistant:

void Abc_QuickSort2( word * pData, int nSize, int fDecrease )
{
    int i, fVerify = 0;
    if ( fDecrease )
    {
        Abc_QuickSort2Dec_rec( pData, 0, nSize - 1 );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] >= (unsigned)pData[i] );
    }
    else
    {
        Abc_QuickSort2Inc_rec( pData, 0, nSize - 1 );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] <= (unsigned)pData[i] );
    }
}